

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void setup_call_hard_reg_args(gen_ctx_t gen_ctx,MIR_insn_t call_insn,MIR_reg_t hard_reg)

{
  void *pvVar1;
  bitmap_t bm;
  
  if ((hard_reg < 0x22) && (*(int *)&call_insn->field_0x18 - 0xa7U < 3)) {
    pvVar1 = call_insn->data;
    if (gen_ctx->optimize_level == 0) {
      bm = *(bitmap_t *)((long)pvVar1 + 8);
      if (bm == (bitmap_t)0x0) {
        bm = bitmap_create2(0x22);
        *(bitmap_t *)((long)pvVar1 + 8) = bm;
      }
    }
    else {
      bm = *(bitmap_t *)((long)pvVar1 + 0x48);
    }
    bitmap_set_bit_p(bm,(ulong)hard_reg);
    return;
  }
  __assert_fail("MIR_call_code_p (call_insn->code) && hard_reg <= ST1_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x2d0,"void setup_call_hard_reg_args(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
}

Assistant:

static void MIR_UNUSED setup_call_hard_reg_args (gen_ctx_t gen_ctx, MIR_insn_t call_insn,
                                                 MIR_reg_t hard_reg) {
  insn_data_t insn_data;

  gen_assert (MIR_call_code_p (call_insn->code) && hard_reg <= MAX_HARD_REG);
  if (optimize_level != 0) {
    bitmap_set_bit_p (((bb_insn_t) call_insn->data)->call_hard_reg_args, hard_reg);
    return;
  }
  if ((insn_data = call_insn->data)->u.call_hard_reg_args == NULL)
    insn_data->u.call_hard_reg_args = (void *) bitmap_create2 (MAX_HARD_REG + 1);
  bitmap_set_bit_p (insn_data->u.call_hard_reg_args, hard_reg);
}